

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O2

bool __thiscall
EqualsRange<FlatMap<Point,_double,_PointCmp>_>::match
          (EqualsRange<FlatMap<Point,_double,_PointCmp>_> *this,FlatMap<Point,_double,_PointCmp> *in
          )

{
  __type_conflict _Var1;
  ostringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ::operator<<((ostream *)local_190,in);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_1b0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &this->expected_);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return _Var1;
}

Assistant:

virtual bool match(const T& in) const override {
        std::ostringstream s;
        s << in;
        return s.str() == expected_;
    }